

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Minisat::DoubleOption::parse(DoubleOption *this,char *str)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  double dVar2;
  double tmp;
  char *end;
  char *span;
  char *local_28;
  char *local_20 [3];
  bool local_1;
  
  local_20[0] = in_RSI;
  bVar1 = match<char_const*>(local_20,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(local_20,*(char **)(in_RDI + 8)), bVar1)) &&
     (bVar1 = match<char_const*>(local_20,"="), bVar1)) {
    dVar2 = strtod(local_20[0],&local_28);
    if (local_28 == (char *)0x0) {
      local_1 = false;
    }
    else {
      if ((*(double *)(in_RDI + 0x30) <= dVar2) &&
         ((((*(byte *)(in_RDI + 0x39) & 1) == 0 || (dVar2 != *(double *)(in_RDI + 0x30))) ||
          (NAN(dVar2) || NAN(*(double *)(in_RDI + 0x30)))))) {
        fprintf(_stderr,"ERROR! value <%s> is too large for option \"%s\".\n",local_20[0],
                *(undefined8 *)(in_RDI + 8));
        exit(1);
      }
      if ((dVar2 <= *(double *)(in_RDI + 0x28)) &&
         ((((*(byte *)(in_RDI + 0x38) & 1) == 0 || (dVar2 != *(double *)(in_RDI + 0x28))) ||
          (NAN(dVar2) || NAN(*(double *)(in_RDI + 0x28)))))) {
        fprintf(_stderr,"ERROR! value <%s> is too small for option \"%s\".\n",local_20[0],
                *(undefined8 *)(in_RDI + 8));
        exit(1);
      }
      *(double *)(in_RDI + 0x40) = dVar2;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        char*  end;
        double tmp = strtod(span, &end);

        if (end == NULL) 
            return false;
        else if (tmp >= range.end && (!range.end_inclusive || tmp != range.end)){
            fprintf(stderr, "ERROR! value <%s> is too large for option \"%s\".\n", span, name);
            exit(1);
        }else if (tmp <= range.begin && (!range.begin_inclusive || tmp != range.begin)){
            fprintf(stderr, "ERROR! value <%s> is too small for option \"%s\".\n", span, name);
            exit(1); }

        value = tmp;
        // fprintf(stderr, "READ VALUE: %g\n", value);

        return true;
    }